

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

Vec4 tcu::getTextureBorderColorFloat(TextureFormat *format,Sampler *sampler)

{
  Channel CVar1;
  TextureChannelClass TVar2;
  TextureSwizzle *pTVar3;
  long in_RCX;
  long lVar4;
  ChannelType in_EDX;
  float fVar5;
  float fVar6;
  float fVar7;
  Vec4 VVar8;
  
  TVar2 = getTextureChannelClass(in_EDX);
  pTVar3 = getBorderColorReadSwizzle((ChannelOrder)sampler);
  fVar5 = 0.0;
  if (TVar2 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar5 = -1.0;
  }
  VVar8.m_data[1] = 0.0;
  VVar8.m_data[0] = fVar5;
  format->order = R;
  format->type = SNORM_INT8;
  format[1].order = R;
  format[1].type = SNORM_INT8;
  lVar4 = 0;
  do {
    CVar1 = pTVar3->components[lVar4];
    if ((long)(int)CVar1 == 4) {
      fVar6 = 0.0;
    }
    else if (CVar1 == CHANNEL_ONE) {
      fVar6 = 1.0;
    }
    else {
      fVar6 = *(float *)(in_RCX + 0x24 + (long)(int)CVar1 * 4);
      if (TVar2 != TEXTURECHANNELCLASS_FLOATING_POINT) {
        fVar7 = 1.0;
        if (fVar6 <= 1.0) {
          fVar7 = fVar6;
        }
        fVar6 = (float)(-(uint)(fVar6 < fVar5) & (uint)fVar5 | ~-(uint)(fVar6 < fVar5) & (uint)fVar7
                       );
      }
    }
    (&format->order)[lVar4] = (ChannelOrder)fVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  VVar8.m_data[2] = 1.0;
  VVar8.m_data[3] = 0.0;
  return (Vec4)VVar8.m_data;
}

Assistant:

static tcu::Vec4 getTextureBorderColorFloat (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const bool						isFloat			= channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool						isSigned		= channelClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const float						valueMin		= (isSigned) ? (-1.0f) : (0.0f);
	const float						valueMax		= 1.0f;
	Vec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0.0f;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1.0f;
		else if (isFloat)
		{
			// floating point values are not clamped
			result[c] = sampler.borderColor.getAccess<float>()[(int)map];
		}
		else
		{
			// fixed point values are clamped to a representable range
			result[c] = de::clamp(sampler.borderColor.getAccess<float>()[(int)map], valueMin, valueMax);
		}
	}

	return result;
}